

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O3

long __thiscall HACD::Graph::AddEdge(Graph *this,long v1,long v2)

{
  pointer *ppGVar1;
  pointer pGVar2;
  pointer pGVar3;
  iterator __position;
  long lVar4;
  long lVar5;
  GraphEdge local_58;
  
  pGVar2 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  GraphEdge::GraphEdge(&local_58);
  __position._M_current =
       (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>::
    _M_realloc_insert<HACD::GraphEdge>(&this->m_edges,__position,&local_58);
  }
  else {
    (__position._M_current)->m_v2 = local_58.m_v2;
    (__position._M_current)->m_concavity = local_58.m_concavity;
    (__position._M_current)->m_error = local_58.m_error;
    (__position._M_current)->m_deleted = local_58.m_deleted;
    *(undefined7 *)&(__position._M_current)->field_0x29 = local_58._41_7_;
    (__position._M_current)->m_name = local_58.m_name;
    (__position._M_current)->m_v1 = local_58.m_v1;
    (__position._M_current)->m_v2 = local_58.m_v2;
    (__position._M_current)->m_concavity = local_58.m_concavity;
    ppGVar1 = &(this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  lVar5 = (long)pGVar3 - (long)pGVar2;
  pGVar2 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (lVar5 >> 4) * -0x5555555555555555;
  *(long *)((long)pGVar2 + lVar5) = lVar4;
  *(long *)((long)pGVar2 + lVar5 + 8) = v1;
  *(long *)((long)pGVar2 + lVar5 + 0x10) = v2;
  local_58.m_name = lVar4;
  SArray<long,_16UL>::Insert
            (&(this->m_vertices).
              super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
              super__Vector_impl_data._M_start[v1].m_edges,&local_58.m_name);
  local_58.m_name = lVar4;
  SArray<long,_16UL>::Insert
            (&(this->m_vertices).
              super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
              super__Vector_impl_data._M_start[v2].m_edges,&local_58.m_name);
  this->m_nE = this->m_nE + 1;
  return lVar4;
}

Assistant:

long Graph::AddEdge(long v1, long v2)
    {
		size_t name = m_edges.size();
		m_edges.push_back(GraphEdge());
        m_edges[name].m_name = static_cast<long>(name);
        m_edges[name].m_v1 = v1;
        m_edges[name].m_v2 = v2;
        m_vertices[v1].AddEdge(static_cast<long>(name));
        m_vertices[v2].AddEdge(static_cast<long>(name));
        m_nE++;
		return static_cast<long>(name);
    }